

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O2

size_t ZSTD_sizeof_CCtx(ZSTD_CCtx *cctx)

{
  ZSTD_CCtx *pZVar1;
  void *pvVar2;
  size_t sVar3;
  long lVar4;
  void *pvVar5;
  long lVar6;
  
  if (cctx != (ZSTD_CCtx *)0x0) {
    pZVar1 = (ZSTD_CCtx *)(cctx->workspace).workspace;
    pvVar2 = (cctx->workspace).workspaceEnd;
    pvVar5 = (cctx->localDict).dictBuffer;
    if (pvVar5 != (void *)0x0) {
      pvVar5 = (void *)(cctx->localDict).dictSize;
    }
    sVar3 = ZSTD_sizeof_CDict((cctx->localDict).cdict);
    lVar6 = (long)pvVar2 - (long)pZVar1;
    lVar4 = lVar6 + 0xdf8;
    if (pZVar1 == cctx) {
      lVar4 = lVar6;
    }
    return lVar4 + sVar3 + (long)pvVar5;
  }
  return 0;
}

Assistant:

size_t ZSTD_sizeof_CCtx(const ZSTD_CCtx* cctx)
{
    if (cctx==NULL) return 0;   /* support sizeof on NULL */
    /* cctx may be in the workspace */
    return (cctx->workspace.workspace == cctx ? 0 : sizeof(*cctx))
           + ZSTD_cwksp_sizeof(&cctx->workspace)
           + ZSTD_sizeof_localDict(cctx->localDict)
           + ZSTD_sizeof_mtctx(cctx);
}